

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O0

bool __thiscall
Assimp::MakeVerboseFormatProcess::MakeVerboseFormat(MakeVerboseFormatProcess *this,aiMesh *pcMesh)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  aiVector3D *paVar15;
  aiColor4D *paVar16;
  aiColor4t<float> *paVar17;
  ulong *puVar18;
  aiFace *paVar19;
  aiVector3D *paVar20;
  undefined8 *puVar21;
  size_type sVar22;
  ulong uVar23;
  aiVertexWeight *paVar24;
  reference __src;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *this_00;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *pvVar25;
  aiVector3D *paVar26;
  ulong uVar27;
  aiVertexWeight *local_258;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *local_228;
  aiColor4t<float> *local_200;
  aiColor4D *local_1d8;
  aiVector3t<float> *local_1b0;
  aiVector3t<float> *local_188;
  aiVector3t<float> *local_160;
  aiVector3t<float> *local_138;
  aiVertexWeight *weightToCopy;
  uint i_2;
  uint p_1;
  aiVertexWeight wNew;
  aiVertexWeight *w;
  uint local_f8;
  uint a_1;
  uint i_1;
  uint q;
  aiFace *pcFace;
  uint local_e0;
  uint a;
  uint iIndex;
  uint i;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *newWeights;
  uint p;
  aiColor4D *apvColorSets [8];
  aiVector3D *apvTextureCoords [8];
  aiVector3D *local_40;
  aiVector3D *pvBitangents;
  aiVector3D *pvTangents;
  aiVector3D *pvNormals;
  aiVector3D *pvPositions;
  uint iNumVerts;
  uint iOldNumVertices;
  aiMesh *pcMesh_local;
  MakeVerboseFormatProcess *this_local;
  
  if (pcMesh != (aiMesh *)0x0) {
    uVar1 = pcMesh->mNumVertices;
    uVar13 = pcMesh->mNumFaces * 3;
    uVar23 = CONCAT44(0,uVar13);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar23;
    uVar14 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    paVar15 = (aiVector3D *)operator_new__(uVar14);
    if (uVar23 != 0) {
      local_138 = paVar15;
      do {
        aiVector3t<float>::aiVector3t(local_138);
        local_138 = local_138 + 1;
      } while (local_138 != paVar15 + uVar23);
    }
    pvTangents = (aiVector3D *)0x0;
    bVar12 = aiMesh::HasNormals(pcMesh);
    if (bVar12) {
      uVar23 = CONCAT44(0,uVar13);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar23;
      uVar14 = SUB168(auVar4 * ZEXT816(0xc),0);
      if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pvTangents = (aiVector3D *)operator_new__(uVar14);
      if (uVar23 != 0) {
        local_160 = pvTangents;
        do {
          aiVector3t<float>::aiVector3t(local_160);
          local_160 = local_160 + 1;
        } while (local_160 != pvTangents + uVar23);
      }
    }
    pvBitangents = (aiVector3D *)0x0;
    local_40 = (aiVector3D *)0x0;
    bVar12 = aiMesh::HasTangentsAndBitangents(pcMesh);
    if (bVar12) {
      uVar23 = CONCAT44(0,uVar13);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar23;
      uVar14 = SUB168(auVar5 * ZEXT816(0xc),0);
      if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pvBitangents = (aiVector3D *)operator_new__(uVar14);
      if (uVar23 != 0) {
        local_188 = pvBitangents;
        do {
          aiVector3t<float>::aiVector3t(local_188);
          local_188 = local_188 + 1;
        } while (local_188 != pvBitangents + uVar23);
      }
      uVar23 = CONCAT44(0,uVar13);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar23;
      uVar14 = SUB168(auVar6 * ZEXT816(0xc),0);
      if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      local_40 = (aiVector3D *)operator_new__(uVar14);
      if (uVar23 != 0) {
        local_1b0 = local_40;
        do {
          aiVector3t<float>::aiVector3t(local_1b0);
          local_1b0 = local_1b0 + 1;
        } while (local_1b0 != local_40 + uVar23);
      }
    }
    memset(apvColorSets + 7,0,0x40);
    memset(&stack0xffffffffffffff38,0,0x40);
    newWeights._4_4_ = 0;
    while (bVar12 = aiMesh::HasTextureCoords(pcMesh,newWeights._4_4_), bVar12) {
      uVar23 = CONCAT44(0,uVar13);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar23;
      uVar14 = SUB168(auVar7 * ZEXT816(0xc),0);
      if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      paVar16 = (aiColor4D *)operator_new__(uVar14);
      if (uVar23 != 0) {
        local_1d8 = paVar16;
        do {
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_1d8);
          local_1d8 = (aiColor4D *)&local_1d8->a;
        } while (local_1d8 != (aiColor4D *)(&paVar16->r + uVar23 * 3));
      }
      apvColorSets[(ulong)newWeights._4_4_ + 7] = paVar16;
      newWeights._4_4_ = newWeights._4_4_ + 1;
    }
    newWeights._4_4_ = 0;
    while (bVar12 = aiMesh::HasVertexColors(pcMesh,newWeights._4_4_), bVar12) {
      uVar23 = CONCAT44(0,uVar13);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar23;
      uVar14 = SUB168(auVar8 * ZEXT816(0x10),0);
      if (SUB168(auVar8 * ZEXT816(0x10),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      paVar17 = (aiColor4t<float> *)operator_new__(uVar14);
      if (uVar23 != 0) {
        local_200 = paVar17;
        do {
          aiColor4t<float>::aiColor4t(local_200);
          local_200 = local_200 + 1;
        } while (local_200 != paVar17 + uVar23);
      }
      *(aiColor4t<float> **)(&stack0xffffffffffffff38 + (ulong)newWeights._4_4_ * 8) = paVar17;
      newWeights._4_4_ = newWeights._4_4_ + 1;
    }
    uVar23 = CONCAT44(0,pcMesh->mNumBones);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar23;
    uVar14 = SUB168(auVar9 * ZEXT816(0x18),0);
    uVar27 = uVar14 + 8;
    if (SUB168(auVar9 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar14) {
      uVar27 = 0xffffffffffffffff;
    }
    puVar18 = (ulong *)operator_new__(uVar27);
    *puVar18 = uVar23;
    pvVar25 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)(puVar18 + 1);
    if (uVar23 != 0) {
      local_228 = pvVar25;
      do {
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::vector(local_228);
        local_228 = local_228 + 1;
      } while (local_228 != pvVar25 + uVar23);
    }
    for (a = 0; a < pcMesh->mNumBones; a = a + 1) {
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                (pvVar25 + a,(ulong)(pcMesh->mBones[a]->mNumWeights * 3));
    }
    local_e0 = 0;
    for (pcFace._4_4_ = 0; pcFace._4_4_ < pcMesh->mNumFaces; pcFace._4_4_ = pcFace._4_4_ + 1) {
      paVar19 = pcMesh->mFaces + pcFace._4_4_;
      for (a_1 = 0; a_1 < paVar19->mNumIndices; a_1 = a_1 + 1) {
        for (local_f8 = 0; local_f8 < pcMesh->mNumBones; local_f8 = local_f8 + 1) {
          for (w._4_4_ = 0; w._4_4_ < pcMesh->mBones[local_f8]->mNumWeights; w._4_4_ = w._4_4_ + 1)
          {
            wNew = (aiVertexWeight)(pcMesh->mBones[local_f8]->mWeights + w._4_4_);
            if (paVar19->mIndices[a_1] == *(uint *)wNew) {
              aiVertexWeight::aiVertexWeight((aiVertexWeight *)&i_2);
              i_2 = local_e0;
              p_1 = *(uint *)((long)wNew + 4);
              std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                        (pvVar25 + local_f8,(value_type *)&i_2);
            }
          }
        }
        paVar26 = pcMesh->mVertices + paVar19->mIndices[a_1];
        paVar20 = paVar15 + local_e0;
        fVar11 = paVar26->y;
        paVar20->x = paVar26->x;
        paVar20->y = fVar11;
        paVar20->z = paVar26->z;
        bVar12 = aiMesh::HasNormals(pcMesh);
        if (bVar12) {
          paVar26 = pcMesh->mNormals + paVar19->mIndices[a_1];
          paVar20 = pvTangents + local_e0;
          fVar11 = paVar26->y;
          paVar20->x = paVar26->x;
          paVar20->y = fVar11;
          paVar20->z = paVar26->z;
        }
        bVar12 = aiMesh::HasTangentsAndBitangents(pcMesh);
        if (bVar12) {
          paVar26 = pcMesh->mTangents + paVar19->mIndices[a_1];
          paVar20 = pvBitangents + local_e0;
          fVar11 = paVar26->y;
          paVar20->x = paVar26->x;
          paVar20->y = fVar11;
          paVar20->z = paVar26->z;
          paVar26 = pcMesh->mBitangents + paVar19->mIndices[a_1];
          paVar20 = local_40 + local_e0;
          fVar11 = paVar26->y;
          paVar20->x = paVar26->x;
          paVar20->y = fVar11;
          paVar20->z = paVar26->z;
        }
        weightToCopy._4_4_ = 0;
        while (bVar12 = aiMesh::HasTextureCoords(pcMesh,weightToCopy._4_4_), bVar12) {
          paVar20 = pcMesh->mTextureCoords[weightToCopy._4_4_];
          uVar2 = paVar19->mIndices[a_1];
          paVar16 = apvColorSets[(ulong)weightToCopy._4_4_ + 7];
          *(undefined8 *)(&paVar16->r + (ulong)local_e0 * 3) = *(undefined8 *)(paVar20 + uVar2);
          (&paVar16->r + (ulong)local_e0 * 3)[2] = paVar20[uVar2].z;
          weightToCopy._4_4_ = weightToCopy._4_4_ + 1;
        }
        weightToCopy._4_4_ = 0;
        while (bVar12 = aiMesh::HasVertexColors(pcMesh,weightToCopy._4_4_), bVar12) {
          paVar16 = pcMesh->mColors[weightToCopy._4_4_];
          uVar2 = paVar19->mIndices[a_1];
          puVar21 = (undefined8 *)
                    (*(long *)(&stack0xffffffffffffff38 + (ulong)weightToCopy._4_4_ * 8) +
                    (ulong)local_e0 * 0x10);
          *puVar21 = *(undefined8 *)(paVar16 + uVar2);
          puVar21[1] = *(undefined8 *)&paVar16[uVar2].b;
          weightToCopy._4_4_ = weightToCopy._4_4_ + 1;
        }
        paVar19->mIndices[a_1] = local_e0;
        local_e0 = local_e0 + 1;
      }
    }
    for (weightToCopy._0_4_ = 0; (uint)weightToCopy < pcMesh->mNumBones;
        weightToCopy._0_4_ = (uint)weightToCopy + 1) {
      paVar24 = pcMesh->mBones[(uint)weightToCopy]->mWeights;
      if (paVar24 != (aiVertexWeight *)0x0) {
        operator_delete__(paVar24);
      }
      bVar12 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::empty
                         (pvVar25 + (uint)weightToCopy);
      if (bVar12) {
        pcMesh->mBones[(uint)weightToCopy]->mWeights = (aiVertexWeight *)0x0;
      }
      else {
        sVar22 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                           (pvVar25 + (uint)weightToCopy);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = sVar22;
        uVar23 = SUB168(auVar10 * ZEXT816(8),0);
        if (SUB168(auVar10 * ZEXT816(8),8) != 0) {
          uVar23 = 0xffffffffffffffff;
        }
        paVar24 = (aiVertexWeight *)operator_new__(uVar23);
        if (sVar22 != 0) {
          local_258 = paVar24;
          do {
            aiVertexWeight::aiVertexWeight(local_258);
            local_258 = local_258 + 1;
          } while (local_258 != paVar24 + sVar22);
        }
        pcMesh->mBones[(uint)weightToCopy]->mWeights = paVar24;
        __src = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[]
                          (pvVar25 + (uint)weightToCopy,0);
        paVar24 = pcMesh->mBones[(uint)weightToCopy]->mWeights;
        sVar22 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                           (pvVar25 + (uint)weightToCopy);
        memcpy(paVar24,__src,sVar22 << 3);
      }
    }
    if (pvVar25 != (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)0x0) {
      this_00 = pvVar25 + *puVar18;
      while (pvVar25 != this_00) {
        this_00 = this_00 + -1;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~vector(this_00);
      }
      operator_delete__(puVar18);
    }
    if (pcMesh->mVertices != (aiVector3D *)0x0) {
      operator_delete__(pcMesh->mVertices);
    }
    pcMesh->mVertices = paVar15;
    newWeights._4_4_ = 0;
    while (bVar12 = aiMesh::HasTextureCoords(pcMesh,newWeights._4_4_), bVar12) {
      if (pcMesh->mTextureCoords[newWeights._4_4_] != (aiVector3D *)0x0) {
        operator_delete__(pcMesh->mTextureCoords[newWeights._4_4_]);
      }
      pcMesh->mTextureCoords[newWeights._4_4_] =
           (aiVector3D *)apvColorSets[(ulong)newWeights._4_4_ + 7];
      newWeights._4_4_ = newWeights._4_4_ + 1;
    }
    newWeights._4_4_ = 0;
    while (bVar12 = aiMesh::HasVertexColors(pcMesh,newWeights._4_4_), bVar12) {
      if (pcMesh->mColors[newWeights._4_4_] != (aiColor4D *)0x0) {
        operator_delete__(pcMesh->mColors[newWeights._4_4_]);
      }
      pcMesh->mColors[newWeights._4_4_] =
           *(aiColor4D **)(&stack0xffffffffffffff38 + (ulong)newWeights._4_4_ * 8);
      newWeights._4_4_ = newWeights._4_4_ + 1;
    }
    pcMesh->mNumVertices = uVar13;
    bVar12 = aiMesh::HasNormals(pcMesh);
    if (bVar12) {
      if (pcMesh->mNormals != (aiVector3D *)0x0) {
        operator_delete__(pcMesh->mNormals);
      }
      pcMesh->mNormals = pvTangents;
    }
    bVar12 = aiMesh::HasTangentsAndBitangents(pcMesh);
    if (bVar12) {
      if (pcMesh->mTangents != (aiVector3D *)0x0) {
        operator_delete__(pcMesh->mTangents);
      }
      pcMesh->mTangents = pvBitangents;
      if (pcMesh->mBitangents != (aiVector3D *)0x0) {
        operator_delete__(pcMesh->mBitangents);
      }
      pcMesh->mBitangents = local_40;
    }
    return pcMesh->mNumVertices != uVar1;
  }
  __assert_fail("__null != pcMesh",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/MakeVerboseFormat.cpp"
                ,0x59,"bool Assimp::MakeVerboseFormatProcess::MakeVerboseFormat(aiMesh *)");
}

Assistant:

bool MakeVerboseFormatProcess::MakeVerboseFormat(aiMesh* pcMesh)
{
    ai_assert(NULL != pcMesh);

    unsigned int iOldNumVertices = pcMesh->mNumVertices;
    const unsigned int iNumVerts = pcMesh->mNumFaces*3;

    aiVector3D* pvPositions = new aiVector3D[ iNumVerts ];

    aiVector3D* pvNormals = NULL;
    if (pcMesh->HasNormals())
    {
        pvNormals = new aiVector3D[iNumVerts];
    }
    aiVector3D* pvTangents = NULL, *pvBitangents = NULL;
    if (pcMesh->HasTangentsAndBitangents())
    {
        pvTangents = new aiVector3D[iNumVerts];
        pvBitangents = new aiVector3D[iNumVerts];
    }

    aiVector3D* apvTextureCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS] = {0};
    aiColor4D* apvColorSets[AI_MAX_NUMBER_OF_COLOR_SETS] = {0};

    unsigned int p = 0;
    while (pcMesh->HasTextureCoords(p))
        apvTextureCoords[p++] = new aiVector3D[iNumVerts];

    p = 0;
    while (pcMesh->HasVertexColors(p))
        apvColorSets[p++] = new aiColor4D[iNumVerts];

    // allocate enough memory to hold output bones and vertex weights ...
    std::vector<aiVertexWeight>* newWeights = new std::vector<aiVertexWeight>[pcMesh->mNumBones];
    for (unsigned int i = 0;i < pcMesh->mNumBones;++i) {
        newWeights[i].reserve(pcMesh->mBones[i]->mNumWeights*3);
    }

    // iterate through all faces and build a clean list
    unsigned int iIndex = 0;
    for (unsigned int a = 0; a< pcMesh->mNumFaces;++a)
    {
        aiFace* pcFace = &pcMesh->mFaces[a];
        for (unsigned int q = 0; q < pcFace->mNumIndices;++q,++iIndex)
        {
            // need to build a clean list of bones, too
            for (unsigned int i = 0;i < pcMesh->mNumBones;++i)
            {
                for (unsigned int a = 0;  a < pcMesh->mBones[i]->mNumWeights;a++)
                {
                    const aiVertexWeight& w = pcMesh->mBones[i]->mWeights[a];
                    if(pcFace->mIndices[q] == w.mVertexId)
                    {
                        aiVertexWeight wNew;
                        wNew.mVertexId = iIndex;
                        wNew.mWeight = w.mWeight;
                        newWeights[i].push_back(wNew);
                    }
                }
            }

            pvPositions[iIndex] = pcMesh->mVertices[pcFace->mIndices[q]];

            if (pcMesh->HasNormals())
            {
                pvNormals[iIndex] = pcMesh->mNormals[pcFace->mIndices[q]];
            }
            if (pcMesh->HasTangentsAndBitangents())
            {
                pvTangents[iIndex] = pcMesh->mTangents[pcFace->mIndices[q]];
                pvBitangents[iIndex] = pcMesh->mBitangents[pcFace->mIndices[q]];
            }

            unsigned int p = 0;
            while (pcMesh->HasTextureCoords(p))
            {
                apvTextureCoords[p][iIndex] = pcMesh->mTextureCoords[p][pcFace->mIndices[q]];
                ++p;
            }
            p = 0;
            while (pcMesh->HasVertexColors(p))
            {
                apvColorSets[p][iIndex] = pcMesh->mColors[p][pcFace->mIndices[q]];
                ++p;
            }
            pcFace->mIndices[q] = iIndex;
        }
    }



    // build output vertex weights
    for (unsigned int i = 0;i < pcMesh->mNumBones;++i)
    {
        delete [] pcMesh->mBones[i]->mWeights;
        if (!newWeights[i].empty()) {
            pcMesh->mBones[i]->mWeights = new aiVertexWeight[newWeights[i].size()];
            aiVertexWeight *weightToCopy = &( newWeights[i][0] );
            memcpy(pcMesh->mBones[i]->mWeights, weightToCopy,
                sizeof(aiVertexWeight) * newWeights[i].size());
        } else {
            pcMesh->mBones[i]->mWeights = NULL;
        }
    }
    delete[] newWeights;

    // delete the old members
    delete[] pcMesh->mVertices;
    pcMesh->mVertices = pvPositions;

    p = 0;
    while (pcMesh->HasTextureCoords(p))
    {
        delete[] pcMesh->mTextureCoords[p];
        pcMesh->mTextureCoords[p] = apvTextureCoords[p];
        ++p;
    }
    p = 0;
    while (pcMesh->HasVertexColors(p))
    {
        delete[] pcMesh->mColors[p];
        pcMesh->mColors[p] = apvColorSets[p];
        ++p;
    }
    pcMesh->mNumVertices = iNumVerts;

    if (pcMesh->HasNormals())
    {
        delete[] pcMesh->mNormals;
        pcMesh->mNormals = pvNormals;
    }
    if (pcMesh->HasTangentsAndBitangents())
    {
        delete[] pcMesh->mTangents;
        pcMesh->mTangents = pvTangents;
        delete[] pcMesh->mBitangents;
        pcMesh->mBitangents = pvBitangents;
    }
    return (pcMesh->mNumVertices != iOldNumVertices);
}